

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

void __thiscall
nv::FloatImage::exponentiate(FloatImage *this,uint base_component,uint num,float power)

{
  float *pfVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  
  if (num != 0) {
    uVar5 = (ulong)((uint)this->m_width * (uint)this->m_height);
    uVar4 = 0;
    do {
      if (uVar5 != 0) {
        pfVar1 = this->m_mem;
        uVar2 = this->m_width * base_component * (uint)this->m_height;
        uVar3 = 0;
        do {
          fVar6 = powf(pfVar1[uVar2 + uVar3],power);
          pfVar1[uVar2 + uVar3] = fVar6;
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      uVar4 = uVar4 + 1;
      base_component = base_component + 1;
    } while (uVar4 != num);
  }
  return;
}

Assistant:

void FloatImage::exponentiate(uint base_component, uint num, float power)
{
	const uint size = m_width * m_height;

	for(uint c = 0; c < num; c++) {
		float * ptr = this->channel(base_component + c);
		
		for(uint i = 0; i < size; i++) {
			ptr[i] = pow(ptr[i], power);
		}
	}
}